

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void plain_array_suite::expand_front(void)

{
  pointer *ppiVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  iterator iVar2;
  iterator second_end;
  iterator iVar3;
  iterator iVar4;
  allocator<int> local_299;
  int local_298 [4];
  iterator local_288;
  size_type local_280;
  undefined1 local_278 [8];
  vector<int,_std::allocator<int>_> expect_5;
  allocator<int> local_229;
  int local_228 [4];
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  vector<int,_std::allocator<int>_> expect_4;
  allocator<int> local_1b9;
  int local_1b8 [4];
  iterator local_1a8;
  size_type local_1a0;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> expect_3;
  allocator<int> local_149;
  int local_148 [4];
  iterator local_138;
  size_type local_130;
  undefined1 local_128 [8];
  vector<int,_std::allocator<int>_> expect_2;
  allocator<int> local_d9;
  int local_d8 [2];
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<int,_std::allocator<int>_> expect_1;
  allocator<int> local_65;
  int local_64;
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> expect;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,
             (value_type (*) [4])&span.member.next);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0xb);
  local_64 = 0xb;
  local_60 = &local_64;
  local_58 = 1;
  std::allocator<int>::allocator(&local_65);
  __l_04._M_len = local_58;
  __l_04._M_array = local_60;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_50,__l_04,&local_65);
  std::allocator<int>::~allocator(&local_65);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_50);
  expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_50);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x62f,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
  vista::circular_view<int,_18446744073709551615UL>::expand_front
            ((circular_view<int,_18446744073709551615UL> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1);
  local_d8[0] = 0;
  local_d8[1] = 0xb;
  local_d0 = local_d8;
  local_c8 = 2;
  std::allocator<int>::allocator(&local_d9);
  __l_03._M_len = local_c8;
  __l_03._M_array = local_d0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_c0,__l_03,&local_d9);
  std::allocator<int>::~allocator(&local_d9);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_c0);
  expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_c0);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x635,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_c0);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x16);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x21);
  local_148[0] = 0;
  local_148[1] = 0xb;
  local_148[2] = 0x16;
  local_148[3] = 0x21;
  local_138 = local_148;
  local_130 = 4;
  std::allocator<int>::allocator(&local_149);
  __l_02._M_len = local_130;
  __l_02._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_128,__l_02,&local_149);
  std::allocator<int>::~allocator(&local_149);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_128);
  expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_128);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x63c,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_128);
  vista::circular_view<int,_18446744073709551615UL>::expand_front
            ((circular_view<int,_18446744073709551615UL> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1);
  local_1b8[0] = 0x21;
  local_1b8[1] = 0;
  local_1b8[2] = 0xb;
  local_1b8[3] = 0x16;
  local_1a8 = local_1b8;
  local_1a0 = 4;
  std::allocator<int>::allocator(&local_1b9);
  __l_01._M_len = local_1a0;
  __l_01._M_array = local_1a8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_198,__l_01,&local_1b9);
  std::allocator<int>::~allocator(&local_1b9);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_198);
  expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_198);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x642,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_198);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x2c);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x37);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)ppiVar1,0x42);
  local_228[0] = 0x16;
  local_228[1] = 0x2c;
  local_228[2] = 0x37;
  local_228[3] = 0x42;
  local_218 = local_228;
  local_210 = 4;
  std::allocator<int>::allocator(&local_229);
  __l_00._M_len = local_210;
  __l_00._M_array = local_218;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_208,__l_00,&local_229);
  std::allocator<int>::~allocator(&local_229);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_208);
  expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::vector<int,_std::allocator<int>_>::end
                          ((vector<int,_std::allocator<int>_> *)local_208);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x64a,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_208);
  vista::circular_view<int,_18446744073709551615UL>::expand_front
            ((circular_view<int,_18446744073709551615UL> *)
             &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,1);
  local_298[0] = 0x42;
  local_298[1] = 0x16;
  local_298[2] = 0x2c;
  local_298[3] = 0x37;
  local_288 = local_298;
  local_280 = 4;
  std::allocator<int>::allocator(&local_299);
  __l._M_len = local_280;
  __l._M_array = local_288;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_278,__l,&local_299);
  std::allocator<int>::~allocator(&local_299);
  ppiVar1 = &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar4 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)ppiVar1);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_278);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_278);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x650,"void plain_array_suite::expand_front()",iVar3,iVar4,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_278);
  return;
}

Assistant:

void expand_front()
{
    int array[4] = {};
    circular_view<int> span(array);
    span.push_back(11);
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 0, 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(22);
    span.push_back(33);
    {
        std::vector<int> expect = { 0, 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 33, 0, 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.push_back(44);
    span.push_back(55);
    span.push_back(66);
    {
        std::vector<int> expect = { 22, 44, 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    span.expand_front();
    {
        std::vector<int> expect = { 66, 22, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}